

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar1;
  uint uVar2;
  anon_union_96_1_493b367e_for_CodeGeneratorRequest_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  size_t sVar4;
  void **ppvVar5;
  const_iterator cVar6;
  size_t sVar7;
  uint index;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x10);
  uVar8 = (ulong)uVar2;
  uVar10 = 0;
  index = 0;
  if (0 < (int)uVar2) {
    uVar10 = uVar2;
    index = 0;
  }
  for (; uVar10 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      (&(this->field_0)._impl_.file_to_generate_.super_RepeatedPtrFieldBase,index);
    sVar4 = internal::WireFormatLite::StringSize(value);
    uVar8 = uVar8 + sVar4;
  }
  lVar9 = uVar8 + (long)*(int *)((long)&this->field_0 + 0x28);
  pRVar1 = &(this->field_0)._impl_.proto_file_;
  ppvVar5 = internal::RepeatedPtrFieldBase::elements(&pRVar1->super_RepeatedPtrFieldBase);
  cVar6 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(pRVar1);
  for (; ppvVar5 != cVar6.it_; ppvVar5 = ppvVar5 + 1) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      ((FileDescriptorProto *)*ppvVar5);
    lVar9 = lVar9 + sVar4;
  }
  sVar4 = lVar9 + (long)*(int *)((long)&this->field_0 + 0x40) * 2;
  pRVar1 = &(this->field_0)._impl_.source_file_descriptors_;
  ppvVar5 = internal::RepeatedPtrFieldBase::elements(&pRVar1->super_RepeatedPtrFieldBase);
  cVar6 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(pRVar1);
  for (; ppvVar5 != cVar6.it_; ppvVar5 = ppvVar5 + 1) {
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      ((FileDescriptorProto *)*ppvVar5);
    sVar4 = sVar4 + sVar7;
  }
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x3) != (undefined1  [96])0x0) {
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
      sVar7 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.parameter_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar7 + 1;
    }
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
      sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::compiler::Version>
                        ((this->field_0)._impl_.compiler_version_);
      sVar4 = sVar4 + sVar7 + 1;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t CodeGeneratorRequest::ByteSizeLong() const {
  const CodeGeneratorRequest& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string file_to_generate = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_file_to_generate().size());
      for (int i = 0, n = this_._internal_file_to_generate().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_file_to_generate().Get(i));
      }
    }
    // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
    {
      total_size += 1UL * this_._internal_proto_file_size();
      for (const auto& msg : this_._internal_proto_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FileDescriptorProto source_file_descriptors = 17;
    {
      total_size += 2UL * this_._internal_source_file_descriptors_size();
      for (const auto& msg : this_._internal_source_file_descriptors()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string parameter = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_parameter());
    }
    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.compiler_version_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}